

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::truncateForPacking
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Literal *value
          ,Field *field)

{
  uint uVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  
  if (*(long *)field == 2) {
    uVar1 = Literal::geti32(value);
    if (*(int *)(field + 8) == 2) {
      local_38.i32 = uVar1 & 0xffff;
      local_28 = 2;
      wasm::Literal::operator=(value,(Literal *)&local_38.func);
    }
    else {
      if (*(int *)(field + 8) != 1) goto LAB_001494c9;
      local_38.i32 = uVar1 & 0xff;
      local_28 = 2;
      wasm::Literal::operator=(value,(Literal *)&local_38.func);
    }
    wasm::Literal::~Literal((Literal *)&local_38.func);
  }
LAB_001494c9:
  wasm::Literal::Literal(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

Literal truncateForPacking(Literal value, const Field& field) {
    if (field.type == Type::i32) {
      int32_t c = value.geti32();
      if (field.packedType == Field::i8) {
        value = Literal(c & 0xff);
      } else if (field.packedType == Field::i16) {
        value = Literal(c & 0xffff);
      }
    }
    return value;
  }